

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain_vine_swap.h
# Opt level: O1

Index __thiscall
Gudhi::persistence_matrix::
Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_false,_false>_>_>
::vine_swap(Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_false,_false>_>_>
            *this,Index columnIndex1,Index columnIndex2)

{
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_false,_false>_>_>
  *pIVar1;
  uint uVar2;
  ID_index IVar3;
  Dimension DVar4;
  uint uVar5;
  undefined4 uVar6;
  _Invoker_type p_Var7;
  _Manager_type p_Var8;
  bool bVar9;
  Index IVar10;
  _Invoker_type p_Var11;
  Column_support *__range2;
  _Invoker_type p_Var12;
  bool bVar13;
  long lVar14;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_false,_false>_>_>
  *pIVar15;
  long lVar16;
  anon_class_1_0_00000001 local_3c;
  anon_class_1_0_00000001 local_3b;
  anon_class_1_0_00000001 local_3a;
  anon_class_1_0_00000001 local_39;
  anon_class_8_1_e4bd5e45 local_38;
  
  p_Var7 = this[1].deathComp_._M_invoker;
  lVar16 = (ulong)columnIndex1 * 0x40;
  if ((ulong)*(uint *)(p_Var7 + lVar16 + 0x18) == 0xffffffff) {
    bVar9 = false;
  }
  else {
    bVar9 = *(uint *)(p_Var7 + (ulong)*(uint *)(p_Var7 + lVar16 + 0x18) * 0x40 + 0x14) <
            *(uint *)(p_Var7 + lVar16 + 0x14);
  }
  lVar14 = (ulong)columnIndex2 * 0x40;
  if ((ulong)*(uint *)(p_Var7 + lVar14 + 0x18) == 0xffffffff) {
    bVar13 = false;
  }
  else {
    bVar13 = *(uint *)(p_Var7 + (ulong)*(uint *)(p_Var7 + lVar14 + 0x18) * 0x40 + 0x14) <
             *(uint *)(p_Var7 + lVar14 + 0x14);
  }
  uVar2 = *(uint *)(p_Var7 + lVar16 + 0x14);
  p_Var12 = p_Var7 + lVar14 + 0x30;
  p_Var11 = p_Var12;
  if ((bool)(bVar9 & bVar13)) {
    do {
      p_Var11 = *(_Invoker_type *)p_Var11;
      if (p_Var11 == p_Var12) {
        return columnIndex1;
      }
    } while (*(uint *)(p_Var11 + 0x10) != uVar2);
    if (p_Var11 != p_Var12) {
      IVar10 = _negative_vine_swap(this,columnIndex1,columnIndex2);
      return IVar10;
    }
  }
  else if (bVar9) {
    do {
      p_Var11 = *(_Invoker_type *)p_Var11;
      if (p_Var11 == p_Var12) {
        return columnIndex1;
      }
    } while (*(uint *)(p_Var11 + 0x10) != uVar2);
    if (p_Var11 != p_Var12) {
      pIVar1 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_false,_false>_>_>
                *)(p_Var7 + lVar16);
      uVar2 = *(uint *)(p_Var7 + lVar16 + 0x14);
      pIVar15 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_false,_false>_>_>
                 *)(p_Var7 + lVar14);
      local_38.targetColumn = pIVar1;
      bVar9 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,false,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,false,false>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,false,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,false,false>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<___matrix::Column_types)7,true,false,false,true,false,false,false>>::Matrix_column_tag,1u>,false>___1_>
                        (pIVar15,pIVar1,&local_39,&local_38,&local_3a,&local_3b,&local_3c);
      if (bVar9) {
        IVar3 = (pIVar1->super_Chain_column_option).pivot_;
        (pIVar1->super_Chain_column_option).pivot_ = (pIVar15->super_Chain_column_option).pivot_;
        (pIVar15->super_Chain_column_option).pivot_ = IVar3;
        DVar4 = (pIVar1->super_Column_dimension_option).dim_;
        (pIVar1->super_Column_dimension_option).dim_ = (pIVar15->super_Column_dimension_option).dim_
        ;
        (pIVar15->super_Column_dimension_option).dim_ = DVar4;
      }
      uVar5 = (pIVar1->super_Chain_column_option).pivot_;
      columnIndex1 = columnIndex2;
      if (uVar2 != uVar5) {
        p_Var8 = this[2].birthComp_.super__Function_base._M_manager;
        uVar6 = *(undefined4 *)(p_Var8 + (ulong)uVar2 * 4);
        *(undefined4 *)(p_Var8 + (ulong)uVar2 * 4) = *(undefined4 *)(p_Var8 + (ulong)uVar5 * 4);
        *(undefined4 *)(p_Var8 + (ulong)uVar5 * 4) = uVar6;
      }
    }
  }
  else if (bVar13) {
    do {
      p_Var11 = *(_Invoker_type *)p_Var11;
      if (p_Var11 == p_Var12) {
        return columnIndex1;
      }
    } while (*(uint *)(p_Var11 + 0x10) != uVar2);
    if (p_Var11 != p_Var12) {
      pIVar1 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_false,_false>_>_>
                *)(p_Var7 + lVar14);
      uVar2 = *(uint *)(p_Var7 + lVar14 + 0x14);
      pIVar15 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_false,_false>_>_>
                 *)(p_Var7 + lVar16);
      local_38.targetColumn = pIVar1;
      bVar9 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,false,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,false,false>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,false,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,false,false>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<___matrix::Column_types)7,true,false,false,true,false,false,false>>::Matrix_column_tag,1u>,false>___1_>
                        (pIVar15,pIVar1,&local_39,&local_38,&local_3a,&local_3b,&local_3c);
      if (bVar9) {
        IVar3 = (pIVar1->super_Chain_column_option).pivot_;
        (pIVar1->super_Chain_column_option).pivot_ = (pIVar15->super_Chain_column_option).pivot_;
        (pIVar15->super_Chain_column_option).pivot_ = IVar3;
        DVar4 = (pIVar1->super_Column_dimension_option).dim_;
        (pIVar1->super_Column_dimension_option).dim_ = (pIVar15->super_Column_dimension_option).dim_
        ;
        (pIVar15->super_Column_dimension_option).dim_ = DVar4;
      }
      uVar5 = (pIVar1->super_Chain_column_option).pivot_;
      if (uVar2 != uVar5) {
        p_Var8 = this[2].birthComp_.super__Function_base._M_manager;
        uVar6 = *(undefined4 *)(p_Var8 + (ulong)uVar2 * 4);
        *(undefined4 *)(p_Var8 + (ulong)uVar2 * 4) = *(undefined4 *)(p_Var8 + (ulong)uVar5 * 4);
        *(undefined4 *)(p_Var8 + (ulong)uVar5 * 4) = uVar6;
      }
    }
  }
  else {
    do {
      p_Var11 = *(_Invoker_type *)p_Var11;
      if (p_Var11 == p_Var12) {
        return columnIndex1;
      }
    } while (*(uint *)(p_Var11 + 0x10) != uVar2);
    if (p_Var11 != p_Var12) {
      IVar10 = _positive_vine_swap(this,columnIndex1,columnIndex2);
      return IVar10;
    }
  }
  return columnIndex1;
}

Assistant:

inline typename Chain_vine_swap<Master_matrix>::Index Chain_vine_swap<Master_matrix>::vine_swap(Index columnIndex1,
                                                                                                Index columnIndex2)
{
  if constexpr (Master_matrix::Option_list::has_column_pairings) {
    GUDHI_CHECK(CP::are_adjacent(_matrix()->get_pivot(columnIndex1), _matrix()->get_pivot(columnIndex2)),
                std::invalid_argument(
                    "Chain_vine_swap::vine_swap - Columns to be swapped need to be adjacent in the 'real' matrix."));
  }

  const bool col1IsNeg = _is_negative_in_pair(columnIndex1);
  const bool col2IsNeg = _is_negative_in_pair(columnIndex2);

  if (col1IsNeg && col2IsNeg) {
    if (_matrix()->is_zero_entry(columnIndex2, _matrix()->get_pivot(columnIndex1))) {
      if constexpr (Master_matrix::Option_list::has_column_pairings) {
        ID_index pivot1 = _matrix()->get_pivot(columnIndex1);
        ID_index pivot2 = _matrix()->get_pivot(columnIndex2);

        CP::negative_transpose(pivot1, pivot2);
        CP::swap_positions(pivot1, pivot2);
      }
      return columnIndex1;
    }
    return _negative_vine_swap(columnIndex1, columnIndex2);
  }

  if (col1IsNeg) {
    if (_matrix()->is_zero_entry(columnIndex2, _matrix()->get_pivot(columnIndex1))) {
      if constexpr (Master_matrix::Option_list::has_column_pairings) {
        ID_index pivot1 = _matrix()->get_pivot(columnIndex1);
        ID_index pivot2 = _matrix()->get_pivot(columnIndex2);

        CP::negative_positive_transpose(pivot1, pivot2);
        CP::swap_positions(pivot1, pivot2);
      }
      return columnIndex1;
    }
    return _negative_positive_vine_swap(columnIndex1, columnIndex2);
  }

  if (col2IsNeg) {
    if (_matrix()->is_zero_entry(columnIndex2, _matrix()->get_pivot(columnIndex1))) {
      if constexpr (Master_matrix::Option_list::has_column_pairings) {
        ID_index pivot1 = _matrix()->get_pivot(columnIndex1);
        ID_index pivot2 = _matrix()->get_pivot(columnIndex2);

        CP::positive_negative_transpose(pivot1, pivot2);
        CP::swap_positions(pivot1, pivot2);
      }
      return columnIndex1;
    }
    return _positive_negative_vine_swap(columnIndex1, columnIndex2);
  }

  if (_matrix()->is_zero_entry(columnIndex2, _matrix()->get_pivot(columnIndex1))) {
    if constexpr (Master_matrix::Option_list::has_column_pairings) {
      ID_index pivot1 = _matrix()->get_pivot(columnIndex1);
      ID_index pivot2 = _matrix()->get_pivot(columnIndex2);

      CP::positive_transpose(pivot1, pivot2);
      CP::swap_positions(pivot1, pivot2);
    }
    return columnIndex1;
  }
  return _positive_vine_swap(columnIndex1, columnIndex2);
}